

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  pointer puVar1;
  pointer ppVar2;
  int local_10 [2];
  
  this->more_ = true;
  this->done_ = false;
  (this->text_buffer_)._M_string_length = 0;
  *(this->text_buffer_)._M_dataplus._M_p = '\0';
  puVar1 = (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->raw_tag_ = 0;
  ppVar2 = (this->state_stack_).
           super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->state_stack_).
    super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_10[1] = 0;
  local_10[0] = 0;
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>
            ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>> *)
             &this->state_stack_,(parse_mode *)(local_10 + 1),local_10);
  puVar1 = (this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar1) {
    (this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
  ::clear(&this->stringref_map_stack_);
  this->nesting_depth_ = 0;
  return;
}

Assistant:

void reset()
    {
        more_ = true;
        done_ = false;
        text_buffer_.clear();
        bytes_buffer_.clear();
        raw_tag_ = 0;
        state_stack_.clear();
        state_stack_.emplace_back(parse_mode::root,0);
        typed_array_.clear();
        stringref_map_stack_.clear();
        nesting_depth_ = 0;
    }